

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O1

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> T,
              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,int *C,int *B,
              int n,int k)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  uVar9 = (ulong)(uint)k;
  if (C == B) {
    if (0 < k) {
      memset(C,0,uVar9 * 4);
    }
    if (0 < n) {
      uVar6 = 0;
      do {
        C[T._M_current[uVar6]] = C[T._M_current[uVar6]] + 1;
        uVar6 = uVar6 + 1;
      } while ((uint)n != uVar6);
    }
  }
  if (0 < k) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      iVar10 = C[uVar6];
      B[uVar6] = iVar5;
      uVar6 = uVar6 + 1;
      iVar5 = iVar10 + iVar5;
    } while (uVar9 != uVar6);
  }
  uVar2 = n - 1;
  uVar6 = (ulong)T._M_current[(long)n + -1];
  iVar5 = B[uVar6];
  uVar11 = uVar2;
  if ((1 < n) && (uVar11 = -n, T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2])) {
    uVar11 = uVar2;
  }
  SA._M_current[iVar5] = uVar11;
  if (0 < n) {
    puVar4 = (uint *)(SA._M_current + iVar5 + 1);
    uVar8 = 0;
    do {
      uVar11 = SA._M_current[uVar8];
      if ((long)(int)uVar11 < 1) {
        if (uVar11 != 0) {
          SA._M_current[uVar8] = ~uVar11;
        }
        uVar6 = uVar6 & 0xffffffff;
      }
      else {
        uVar12 = uVar11 - 1;
        uVar1 = T._M_current[uVar12];
        SA._M_current[uVar8] = ~uVar1;
        if (uVar1 == (uint)uVar6) {
          uVar6 = uVar6 & 0xffffffff;
        }
        else {
          B[(int)(uint)uVar6] = (int)((ulong)((long)puVar4 - (long)SA._M_current) >> 2);
          puVar4 = (uint *)(SA._M_current + B[(int)uVar1]);
          uVar6 = (ulong)uVar1;
        }
        if ((uVar11 != 1) && (T._M_current[(long)(int)uVar11 + -2] < (int)uVar6)) {
          uVar12 = -uVar11;
        }
        *puVar4 = uVar12;
        puVar4 = puVar4 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)n != uVar8);
  }
  if (C == B) {
    if (0 < k) {
      memset(C,0,uVar9 * 4);
    }
    if (0 < n) {
      uVar6 = 0;
      do {
        C[T._M_current[uVar6]] = C[T._M_current[uVar6]] + 1;
        uVar6 = uVar6 + 1;
      } while ((uint)n != uVar6);
    }
  }
  if (0 < k) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + C[uVar6];
      B[uVar6] = iVar5;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  if (n < 1) {
    iVar5 = -1;
  }
  else {
    piVar7 = SA._M_current + *B;
    iVar10 = 0;
    uVar6 = 0xffffffff;
    uVar9 = (ulong)uVar2;
    do {
      uVar2 = SA._M_current[uVar9];
      if ((long)(int)uVar2 < 1) {
        if (uVar2 == 0) {
          uVar6 = uVar9 & 0xffffffff;
        }
        else {
          SA._M_current[uVar9] = ~uVar2;
        }
      }
      else {
        uVar11 = uVar2 - 1;
        iVar5 = T._M_current[uVar11];
        SA._M_current[uVar9] = iVar5;
        if (iVar5 != iVar10) {
          B[iVar10] = (int)((ulong)((long)piVar7 - (long)SA._M_current) >> 2);
          piVar7 = SA._M_current + B[iVar5];
          iVar10 = iVar5;
        }
        if ((uVar2 != 1) && (iVar10 < T._M_current[(long)(int)uVar2 + -2])) {
          uVar11 = ~T._M_current[(long)(int)uVar2 + -2];
        }
        piVar7[-1] = uVar11;
        piVar7 = piVar7 + -1;
      }
      iVar5 = (int)uVar6;
      bVar3 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
  }
  return iVar5;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}